

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool cfd::core::Privkey::HasWif(string *wif,NetType *net_type,bool *is_compressed)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  uint32_t prefix;
  size_t is_uncompressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  ByteData data;
  uint local_7c;
  CfdSourceLocation local_78;
  size_t local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  local_60 = 0;
  iVar2 = wally_wif_is_uncompressed((wif->_M_dataplus)._M_p,&local_60);
  if (iVar2 == 0) {
    CryptoUtil::DecodeBase58Check((ByteData *)&local_40,(string *)wif);
    sVar3 = ByteData::GetDataSize((ByteData *)&local_40);
    bVar5 = 0x20 < sVar3;
    if (bVar5) {
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                         (ByteData *)&local_40);
      bVar1 = *local_58._M_impl.super__Vector_impl_data._M_start;
      local_7c = (uint)bVar1;
      if (net_type != (NetType *)0x0) {
        GetKeyFormatList();
        for (pcVar4 = local_78.filename; pcVar4 != (char *)CONCAT44(local_78._12_4_,local_78.line);
            pcVar4 = pcVar4 + 0x78) {
          if (bVar1 == pcVar4[0x31]) {
            *net_type = (byte)pcVar4[0x30] ^ kTestnet;
            ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::
            ~vector((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                    &local_78);
            goto LAB_0039f303;
          }
        }
        ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                  ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                   &local_78);
        local_78.filename = "cfdcore_key.cpp";
        local_78.line = 0x31c;
        local_78.funcname = "HasWif";
        logger::warn<unsigned_int&>(&local_78,"Invalid Privkey format. prefix={}",&local_7c);
        *net_type = kTestnet;
      }
LAB_0039f303:
      if (is_compressed != (bool *)0x0) {
        *is_compressed = local_60 == 0;
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Privkey::HasWif(
    const std::string &wif, NetType *net_type, bool *is_compressed) {
  static constexpr size_t kWifMinimumSize = EC_PRIVATE_KEY_LEN + 1;

  size_t is_uncompressed = 0;
  int ret = wally_wif_is_uncompressed(wif.c_str(), &is_uncompressed);
  if (ret != WALLY_OK) {
    // contains check wif.
    return false;
  }

  bool has_wif = false;
  ByteData data = CryptoUtil::DecodeBase58Check(wif);
  if (data.GetDataSize() >= kWifMinimumSize) {
    std::vector<uint8_t> key_data = data.GetBytes();
    uint32_t prefix = key_data[0];

    if (net_type != nullptr) {
      bool has_prefix = false;
      for (const auto &format : GetKeyFormatList()) {
        if (format.GetWifPrefix() == prefix) {
          *net_type = format.GetNetType();
          has_prefix = true;
          break;
        }
      }
      if (!has_prefix) {
        warn(CFD_LOG_SOURCE, "Invalid Privkey format. prefix={}", prefix);
        *net_type = NetType::kTestnet;
      }
    }

    if (is_compressed != nullptr) {
      *is_compressed = (is_uncompressed == 0) ? true : false;
    }
    has_wif = true;
  }
  return has_wif;
}